

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_0::safe_int_internal<long>
               (string_view text,Nonnull<long_*> value_p,int base)

{
  bool bVar1;
  Nonnull<long_*> in_R8;
  string_view text_00;
  string_view text_01;
  bool local_2d;
  int local_2c;
  bool negative;
  Nonnull<long_*> plStack_28;
  int base_local;
  Nonnull<long_*> value_p_local;
  string_view text_local;
  
  text_local._M_len = (size_t)text._M_str;
  value_p_local = (Nonnull<long_*>)text._M_len;
  *value_p = 0;
  local_2c = base;
  plStack_28 = value_p;
  bVar1 = safe_parse_sign_and_base((Nonnull<absl::string_view_*>)&value_p_local,&local_2c,&local_2d)
  ;
  if (bVar1) {
    if ((local_2d & 1U) == 0) {
      text_00._M_str._0_4_ = local_2c;
      text_00._M_len = text_local._M_len;
      text_00._M_str._4_4_ = 0;
      text_local._M_str._7_1_ =
           safe_parse_positive_int<long>
                     ((anon_unknown_0 *)value_p_local,text_00,(int)plStack_28,in_R8);
    }
    else {
      text_01._M_str._0_4_ = local_2c;
      text_01._M_len = text_local._M_len;
      text_01._M_str._4_4_ = 0;
      text_local._M_str._7_1_ =
           safe_parse_negative_int<long>
                     ((anon_unknown_0 *)value_p_local,text_01,(int)plStack_28,in_R8);
    }
  }
  else {
    text_local._M_str._7_1_ = false;
  }
  return text_local._M_str._7_1_;
}

Assistant:

inline bool safe_int_internal(absl::string_view text,
                              absl::Nonnull<IntType*> value_p, int base) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign_and_base(&text, &base, &negative)) {
    return false;
  }
  if (!negative) {
    return safe_parse_positive_int(text, base, value_p);
  } else {
    return safe_parse_negative_int(text, base, value_p);
  }
}